

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::GenerateGraphViz(cmake *this,char *fileName)

{
  string *psVar1;
  string fallbackSettingsFile;
  string settingsFile;
  cmGraphVizWriter gvWriter;
  char *local_168 [4];
  char *local_148 [4];
  cmGraphVizWriter local_128;
  
  cmGraphVizWriter::cmGraphVizWriter(&local_128,this->GlobalGenerator);
  psVar1 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_148,(string *)psVar1);
  std::__cxx11::string::append((char *)local_148);
  psVar1 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_168,(string *)psVar1);
  std::__cxx11::string::append((char *)local_168);
  cmGraphVizWriter::ReadSettings(&local_128,local_148[0],local_168[0]);
  cmGraphVizWriter::WritePerTargetFiles(&local_128,fileName);
  cmGraphVizWriter::WriteTargetDependersFiles(&local_128,fileName);
  cmGraphVizWriter::WriteGlobalFile(&local_128,fileName);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_148);
  cmGraphVizWriter::~cmGraphVizWriter(&local_128);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const char* fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmGraphVizWriter gvWriter(this->GetGlobalGenerator());

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter.ReadSettings(settingsFile.c_str(), fallbackSettingsFile.c_str());

  gvWriter.WritePerTargetFiles(fileName);
  gvWriter.WriteTargetDependersFiles(fileName);
  gvWriter.WriteGlobalFile(fileName);

#endif
}